

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void EthBasePort::PrintIP(ostream *outStr,char *name,uint8_t *addr,bool swap16)

{
  ostream *poVar1;
  undefined7 in_register_00000009;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  
  poVar1 = std::operator<<(outStr,name);
  poVar1 = std::operator<<(poVar1,": ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  if ((int)CONCAT71(in_register_00000009,swap16) == 0) {
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*addr);
    poVar1 = std::operator<<(poVar1,".");
    pbVar2 = addr + 1;
    lVar4 = 3;
    lVar3 = 2;
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[1]);
    poVar1 = std::operator<<(poVar1,".");
    lVar4 = 2;
    lVar3 = 3;
    pbVar2 = addr;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[lVar3]);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[lVar4]);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void EthBasePort::PrintIP(std::ostream &outStr, const char* name, const uint8_t *addr, bool swap16)
{
    if (swap16) {
        outStr << name << ": " << std::dec
               << (int)addr[1] << "." << (int)addr[0] << "." << (int)addr[3] << "." << (int)addr[2]
               << std::endl;
    }
    else {
        outStr << name << ": " << std::dec
               << (int)addr[0] << "." << (int)addr[1] << "." << (int)addr[2] << "." << (int)addr[3]
               << std::endl;
    }
}